

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int transfer_set_state(TRANSFER_HANDLE transfer,AMQP_VALUE state_value)

{
  int iVar1;
  AMQP_VALUE local_30;
  AMQP_VALUE state_amqp_value;
  TRANSFER_INSTANCE *transfer_instance;
  int result;
  AMQP_VALUE state_value_local;
  TRANSFER_HANDLE transfer_local;
  
  if (transfer == (TRANSFER_HANDLE)0x0) {
    transfer_instance._4_4_ = 0x1ee1;
  }
  else {
    if (state_value == (AMQP_VALUE)0x0) {
      local_30 = (AMQP_VALUE)0x0;
    }
    else {
      local_30 = amqpvalue_clone(state_value);
    }
    if (local_30 == (AMQP_VALUE)0x0) {
      transfer_instance._4_4_ = 0x1ef1;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(transfer->composite_value,7,local_30);
      if (iVar1 == 0) {
        transfer_instance._4_4_ = 0;
      }
      else {
        transfer_instance._4_4_ = 0x1ef7;
      }
      amqpvalue_destroy(local_30);
    }
  }
  return transfer_instance._4_4_;
}

Assistant:

int transfer_set_state(TRANSFER_HANDLE transfer, AMQP_VALUE state_value)
{
    int result;

    if (transfer == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        AMQP_VALUE state_amqp_value;
        if (state_value == NULL)
        {
            state_amqp_value = NULL;
        }
        else
        {
            state_amqp_value = amqpvalue_clone(state_value);
        }
        if (state_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(transfer_instance->composite_value, 7, state_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(state_amqp_value);
        }
    }

    return result;
}